

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicseffect.cpp
# Opt level: O3

void __thiscall QGraphicsOpacityEffect::setOpacityMask(QGraphicsOpacityEffect *this,QBrush *mask)

{
  long lVar1;
  char cVar2;
  long in_FS_OFFSET;
  void *local_38;
  QBrush *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QGraphicsEffect).field_0x8;
  cVar2 = QBrush::operator==((QBrush *)(lVar1 + 0xb0),mask);
  if (cVar2 == '\0') {
    QBrush::operator=((QBrush *)(lVar1 + 0xb0),mask);
    *(byte *)(lVar1 + 0xb8) =
         *(byte *)(lVar1 + 0xb8) & 0xfb | (*(int *)(*(long *)mask + 4) != 0) << 2;
    lVar1 = *(long *)(*(long *)&(this->super_QGraphicsEffect).field_0x8 + 0x78);
    if (lVar1 != 0) {
      (**(code **)(**(long **)(lVar1 + 8) + 0x58))();
    }
    local_38 = (void *)0x0;
    local_30 = mask;
    QMetaObject::activate((QObject *)this,&staticMetaObject,1,&local_38);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsOpacityEffect::setOpacityMask(const QBrush &mask)
{
    Q_D(QGraphicsOpacityEffect);
    if (d->opacityMask == mask)
        return;

    d->opacityMask = mask;
    d->hasOpacityMask = (mask.style() != Qt::NoBrush);
    update();

    emit opacityMaskChanged(mask);
}